

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

void __thiscall
TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>::
ClearNodeVector(TMap<FName,_FOptionalMapinfoDataPtr,_THashTraits<FName>,_TValueTraits<FOptionalMapinfoDataPtr>_>
                *this)

{
  Node *block;
  long *plVar1;
  long lVar2;
  hash_t i;
  ulong uVar3;
  
  lVar2 = 0x10;
  for (uVar3 = 0; block = this->Nodes, uVar3 < this->Size; uVar3 = uVar3 + 1) {
    if ((*(long *)((long)block + lVar2 + -0x10) != 1) &&
       (plVar1 = *(long **)((long)&block->Next + lVar2), plVar1 != (long *)0x0)) {
      (**(code **)(*plVar1 + 8))();
    }
    lVar2 = lVar2 + 0x18;
  }
  M_Free(block);
  this->Nodes = (Node *)0x0;
  this->LastFree = (Node *)0x0;
  this->Size = 0;
  this->NumUsed = 0;
  return;
}

Assistant:

void ClearNodeVector()
	{
		for (hash_t i = 0; i < Size; ++i)
		{
			if (!Nodes[i].IsNil())
			{
				Nodes[i].~Node();
			}
		}
		M_Free(Nodes);
		Nodes = NULL;
		Size = 0;
		LastFree = NULL;
		NumUsed = 0;
	}